

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareFieldValueUsingParentFields
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *field,int index1,int index2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  byte bVar2;
  int iVar3;
  Message *message1_00;
  Message *message2_00;
  SpecificField *specific_field;
  Nonnull<const_char_*> pcVar4;
  bool bVar5;
  Metadata MVar6;
  Metadata MVar7;
  FieldContext field_context;
  
  iVar3 = (*(((this->field_comparator_).default_impl)->super_SimpleFieldComparator).
            super_FieldComparator._vptr_FieldComparator[2])();
  if ((iVar3 != 2) || (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10)
     ) {
    return iVar3 == 0;
  }
  MVar6 = Message::GetMetadata(message1);
  MVar7 = Message::GetMetadata(message2);
  bVar2 = field->field_0x1;
  bVar5 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar5) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar5,0xbf < bVar2,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      message1_00 = Reflection::GetMessage(MVar6.reflection,message1,field,(MessageFactory *)0x0);
    }
    else {
      message1_00 = Reflection::GetRepeatedMessage(MVar6.reflection,message1,field,index1);
    }
    bVar2 = field->field_0x1;
    bVar5 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar5) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar5,0xbf < bVar2,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        message2_00 = Reflection::GetMessage(MVar7.reflection,message2,field,(MessageFactory *)0x0);
      }
      else {
        message2_00 = Reflection::GetRepeatedMessage(MVar7.reflection,message2,field,index2);
      }
      if (parent_fields !=
          (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           *)0x0) {
        specific_field = PushSpecificField(parent_fields);
        specific_field->message1 = message1;
        specific_field->message2 = message2;
        specific_field->unpacked_any = unpacked_any;
        specific_field->field = field;
        AddSpecificIndex(specific_field,message1,field,index1);
        AddSpecificNewIndex(specific_field,message2,field,index2);
        bVar5 = Compare(this,message1_00,message2_00,0,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        return bVar5;
      }
      bVar5 = Compare(this,message1_00,message2_00);
      return bVar5;
    }
  }
  else {
    CompareFieldValueUsingParentFields();
  }
  CompareFieldValueUsingParentFields();
}

Assistant:

bool MessageDifferencer::CompareFieldValueUsingParentFields(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* field, int index1, int index2,
    std::vector<SpecificField>* parent_fields) {
  FieldContext field_context(parent_fields);
  FieldComparator::ComparisonResult result = GetFieldComparisonResult(
      message1, message2, field, index1, index2, &field_context);

  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      result == FieldComparator::RECURSE) {
    // Get the nested messages and compare them using one of the Compare
    // methods.
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const Message& m1 =
        field->is_repeated()
            ? reflection1->GetRepeatedMessage(message1, field, index1)
            : reflection1->GetMessage(message1, field);
    const Message& m2 =
        field->is_repeated()
            ? reflection2->GetRepeatedMessage(message2, field, index2)
            : reflection2->GetMessage(message2, field);

    // parent_fields is used in calls to Reporter methods.
    if (parent_fields != nullptr) {
      // Append currently compared field to the end of parent_fields.
      SpecificField& specific_field = PushSpecificField(parent_fields);
      specific_field.message1 = &message1;
      specific_field.message2 = &message2;
      specific_field.unpacked_any = unpacked_any;
      specific_field.field = field;
      AddSpecificIndex(&specific_field, message1, field, index1);
      AddSpecificNewIndex(&specific_field, message2, field, index2);
      const bool compare_result = Compare(m1, m2, false, parent_fields);
      parent_fields->pop_back();
      return compare_result;
    } else {
      // Recreates parent_fields as if m1 and m2 had no parents.
      return Compare(m1, m2);
    }
  } else {
    return (result == FieldComparator::SAME);
  }
}